

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifneuron.cxx
# Opt level: O0

void __thiscall
IfNeuron::IfNeuron(IfNeuron *this,Time *time,double v_0,double theta,double spikeheight,double tau,
                  double v_rest,string *name,string *type)

{
  Time *time_00;
  string *reversal;
  double time_01;
  VoltageDependance *this_00;
  StochasticVariable *integrator;
  double dVar1;
  allocator<char> local_4b9;
  string local_4b8;
  allocator<char> local_491;
  string local_490;
  undefined1 local_46a;
  allocator<char> local_469;
  string local_468;
  allocator<char> local_441;
  string local_440;
  allocator<char> local_419;
  string local_418;
  allocator<char> local_3f1;
  string local_3f0;
  Unit local_3d0;
  allocator<char> local_361;
  string local_360;
  allocator<char> local_339;
  string local_338;
  Unit local_318;
  allocator<char> local_2a9;
  string local_2a8;
  allocator<char> local_281;
  string local_280;
  Unit local_260;
  Unit local_1f8;
  allocator<char> local_189;
  string local_188;
  allocator<char> local_161;
  string local_160;
  allocator<char> local_139;
  string local_138;
  allocator<char> local_111;
  string local_110;
  allocator<char> local_e9;
  string local_e8;
  allocator<char> local_c1;
  string local_c0;
  string local_90;
  string local_70;
  string *local_50;
  string *type_local;
  string *name_local;
  double v_rest_local;
  double tau_local;
  double spikeheight_local;
  double theta_local;
  double v_0_local;
  Time *time_local;
  IfNeuron *this_local;
  
  local_50 = type;
  type_local = name;
  name_local = (string *)v_rest;
  v_rest_local = tau;
  tau_local = spikeheight;
  spikeheight_local = theta;
  theta_local = v_0;
  v_0_local = (double)time;
  time_local = (Time *)this;
  std::__cxx11::string::string((string *)&local_70,(string *)name);
  std::__cxx11::string::string((string *)&local_90,(string *)local_50);
  SpikingNeuron::SpikingNeuron(&this->super_SpikingNeuron,time,&local_70,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_70);
  time_01 = v_0_local;
  dVar1 = theta_local;
  (this->super_SpikingNeuron).super_Neuron._vptr_Neuron = (_func_int **)&PTR_addStimulus_0018f0b0;
  (this->super_SpikingNeuron).super_StochasticEventGenerator.super_StochasticVariable.
  super_StochasticProcess.super_Parametric._vptr_Parametric = (_func_int **)&PTR__IfNeuron_0018f118;
  (this->super_SpikingNeuron).super_StochasticEventGenerator.super_StochasticVariable.
  super_StochasticProcess.super_TimeDependent._vptr_TimeDependent =
       (_func_int **)&PTR__IfNeuron_0018f1b0;
  (this->super_SpikingNeuron).super_StochasticEventGenerator.super_StochasticVariable.
  super_StochasticProcess.super_Physical._vptr_Physical = (_func_int **)&PTR__IfNeuron_0018f1f8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c0,"V",&local_c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e8,"Differential Equation",&local_e9);
  DifferentialEquation::DifferentialEquation
            (&this->ifneuronMembrane,(Time *)time_01,dVar1,0.0,&local_c0,&local_e8);
  std::__cxx11::string::~string((string *)&local_e8);
  std::allocator<char>::~allocator(&local_e9);
  std::__cxx11::string::~string((string *)&local_c0);
  std::allocator<char>::~allocator(&local_c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_110,"threshold",&local_111);
  Parametric::addParameter
            ((Parametric *)&(this->super_SpikingNeuron).super_StochasticEventGenerator,&local_110);
  std::__cxx11::string::~string((string *)&local_110);
  std::allocator<char>::~allocator(&local_111);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_138,"spike-height",&local_139)
  ;
  Parametric::addParameter
            ((Parametric *)&(this->super_SpikingNeuron).super_StochasticEventGenerator,&local_138);
  std::__cxx11::string::~string((string *)&local_138);
  std::allocator<char>::~allocator(&local_139);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_160,"membrane",&local_161);
  Parametric::addParameter
            ((Parametric *)&(this->super_SpikingNeuron).super_StochasticEventGenerator,&local_160);
  std::__cxx11::string::~string((string *)&local_160);
  std::allocator<char>::~allocator(&local_161);
  std::__cxx11::string::operator=
            ((string *)
             &(this->super_SpikingNeuron).super_StochasticEventGenerator.super_StochasticVariable.
              super_StochasticProcess.super_Physical.physicalDescription,"voltage");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_188,"LIF neuron membrane",&local_189);
  StochasticProcess::setDescription((StochasticProcess *)&this->ifneuronMembrane,&local_188);
  std::__cxx11::string::~string((string *)&local_188);
  std::allocator<char>::~allocator(&local_189);
  this->ifneuronSpikeHeight = tau_local;
  (this->super_SpikingNeuron).super_StochasticEventGenerator.eventCurrentValue = false;
  (this->super_SpikingNeuron).super_StochasticEventGenerator.eventNextValue = false;
  this->ifneuronTheta = spikeheight_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_280,"m",&local_281);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2a8,"V",&local_2a9);
  Unit::Unit(&local_260,&local_280,&local_2a8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_338,"u",&local_339);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_360,"F",&local_361);
  Unit::Unit(&local_318,&local_338,&local_360);
  operator*(&local_1f8,&local_260,&local_318);
  Physical::setUnit(&(this->ifneuronMembrane).super_StochasticVariable.super_StochasticProcess.
                     super_Physical,&local_1f8);
  Unit::~Unit(&local_1f8);
  Unit::~Unit(&local_318);
  std::__cxx11::string::~string((string *)&local_360);
  std::allocator<char>::~allocator(&local_361);
  std::__cxx11::string::~string((string *)&local_338);
  std::allocator<char>::~allocator(&local_339);
  Unit::~Unit(&local_260);
  std::__cxx11::string::~string((string *)&local_2a8);
  std::allocator<char>::~allocator(&local_2a9);
  std::__cxx11::string::~string((string *)&local_280);
  std::allocator<char>::~allocator(&local_281);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3f0,"m",&local_3f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_418,"V",&local_419);
  Unit::Unit(&local_3d0,&local_3f0,&local_418);
  Unit::operator=(&(this->super_SpikingNeuron).super_StochasticEventGenerator.
                   super_StochasticVariable.super_StochasticProcess.super_Physical.physicalUnit,
                  &local_3d0);
  Unit::~Unit(&local_3d0);
  std::__cxx11::string::~string((string *)&local_418);
  std::allocator<char>::~allocator(&local_419);
  std::__cxx11::string::~string((string *)&local_3f0);
  std::allocator<char>::~allocator(&local_3f1);
  this_00 = (VoltageDependance *)operator_new(0x160);
  reversal = name_local;
  local_46a = 1;
  dVar1 = 1.0 / v_rest_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_440,"leak",&local_441);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_468,"Weighted Difference",&local_469);
  VoltageDependance::VoltageDependance(this_00,dVar1,(double)reversal,&local_440,&local_468);
  local_46a = 0;
  integrator = (StochasticVariable *)operator_new(0x148);
  time_00 = (this->super_SpikingNeuron).super_StochasticEventGenerator.super_StochasticVariable.
            super_StochasticProcess.super_TimeDependent.xTime;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_490,"t",&local_491);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_4b8,"Time Process",&local_4b9)
  ;
  TimeProcess::TimeProcess((TimeProcess *)integrator,time_00,&local_490,&local_4b8);
  DifferentialEquation::addTerm(&this->ifneuronMembrane,(StochasticFunction *)this_00,integrator);
  std::__cxx11::string::~string((string *)&local_4b8);
  std::allocator<char>::~allocator(&local_4b9);
  std::__cxx11::string::~string((string *)&local_490);
  std::allocator<char>::~allocator(&local_491);
  std::__cxx11::string::~string((string *)&local_468);
  std::allocator<char>::~allocator(&local_469);
  std::__cxx11::string::~string((string *)&local_440);
  std::allocator<char>::~allocator(&local_441);
  return;
}

Assistant:

IfNeuron::IfNeuron(Time *time, double v_0, double theta, double spikeheight, double tau, double v_rest, const string& name, const string& type)
	: SpikingNeuron(time, name, type), ifneuronMembrane(time, v_0, 0.0, "V")
{
	// parameter accessors
	addParameter("threshold");
	addParameter("spike-height");
	addParameter("membrane");
	
	// write descriptions
	physicalDescription = "voltage";
	ifneuronMembrane.setDescription("LIF neuron membrane");
	
	// assign values
	ifneuronSpikeHeight = spikeheight;
	eventCurrentValue = false;
	eventNextValue = false;
	ifneuronTheta = theta;	
	ifneuronMembrane.setUnit( Unit("m","V") * Unit("u","F") );
	physicalUnit = Unit("m","V");
	
	// add decay terms
	ifneuronMembrane.addTerm( new VoltageDependance(1.0/tau, v_rest, "leak"), new TimeProcess(xTime) );
}